

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  processingInstructionSAXFunc p_Var2;
  int iVar3;
  uint val;
  int iVar4;
  xmlCatalogAllow xVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlParserInputPtr pxVar8;
  ulong uVar9;
  ulong uVar10;
  int l;
  int local_54;
  xmlChar *local_50;
  int local_44;
  size_t local_40;
  ulong local_38;
  
  uVar9 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar9 = 10000000;
  }
  pxVar8 = ctxt->input;
  pxVar6 = pxVar8->cur;
  if (*pxVar6 != '<') {
    return;
  }
  if (pxVar6[1] != '?') {
    return;
  }
  iVar3 = pxVar8->id;
  xVar1 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  pxVar8->cur = pxVar6 + 2;
  pxVar8->col = pxVar8->col + 2;
  if (pxVar6[2] == '\0') {
    xmlParserInputGrow(pxVar8,0xfa);
  }
  if (ctxt->progressive == 0) {
    pxVar8 = ctxt->input;
    if ((500 < (long)pxVar8->cur - (long)pxVar8->base) &&
       ((long)pxVar8->end - (long)pxVar8->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  pxVar6 = xmlParsePITarget(ctxt);
  if (pxVar6 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
  }
  else {
    pxVar8 = ctxt->input;
    pxVar7 = pxVar8->cur;
    if ((*pxVar7 != '?') || (pxVar7[1] != '>')) {
      pxVar7 = (xmlChar *)(*xmlMallocAtomic)(100);
      if (pxVar7 != (xmlChar *)0x0) {
        local_44 = iVar3;
        local_38 = uVar9;
        iVar3 = xmlSkipBlankChars(ctxt);
        if (iVar3 == 0) {
          xmlFatalErrMsgStr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar6);
        }
        local_50 = pxVar6;
        val = xmlCurrentChar(ctxt,&local_54);
        iVar3 = 0;
        uVar10 = 0;
        uVar9 = 100;
        do {
          if ((int)val < 0x100) {
            if ((int)val < 0x20) {
              if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) goto LAB_0015bb6f;
            }
            else if ((val == 0x3f) && (ctxt->input->cur[1] == '>')) {
              pxVar7[uVar10] = '\0';
              pxVar8 = ctxt->input;
              if (local_44 != pxVar8->id) {
                xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                               "PI declaration doesn\'t start and stop in the same entity\n");
                pxVar8 = ctxt->input;
              }
              pxVar6 = pxVar8->cur;
              pxVar8->cur = pxVar6 + 2;
              pxVar8->col = pxVar8->col + 2;
              if (pxVar6[2] == '\0') {
                xmlParserInputGrow(pxVar8,0xfa);
              }
              pxVar6 = local_50;
              if ((((uint)xVar1 < 2) &&
                  (iVar3 = xmlStrEqual(local_50,(xmlChar *)"oasis-xml-catalog"), iVar3 != 0)) &&
                 (xVar5 = xmlCatalogGetDefaults(),
                 (xVar5 & ~XML_CATA_ALLOW_GLOBAL) == XML_CATA_ALLOW_DOCUMENT)) {
                xmlParseCatalogPI(ctxt,pxVar7);
              }
              if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
                 (p_Var2 = ctxt->sax->processingInstruction,
                 p_Var2 != (processingInstructionSAXFunc)0x0)) {
                (*p_Var2)(ctxt->userData,pxVar6,pxVar7);
              }
              goto LAB_0015bb90;
            }
          }
          else if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) {
LAB_0015bb6f:
            pxVar7[uVar10] = '\0';
            xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",local_50
                             );
LAB_0015bb90:
            (*xmlFree)(pxVar7);
            goto LAB_0015bb52;
          }
          pxVar6 = pxVar7;
          local_40 = uVar9;
          if (uVar9 <= uVar10 + 5) {
            local_40 = uVar9 * 2;
            pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar7,local_40);
            if (pxVar6 == (xmlChar *)0x0) {
              xmlErrMemory(ctxt,(char *)0x0);
              goto LAB_0015bbb2;
            }
          }
          if (iVar3 < 0x32) {
            iVar3 = iVar3 + 1;
          }
          else {
            if (ctxt->progressive == 0) {
              pxVar8 = ctxt->input;
              if (((((long)pxVar8->cur - (long)pxVar8->base < 0x1f5) ||
                   (499 < (long)pxVar8->end - (long)pxVar8->cur)) ||
                  (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
                 ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                xmlGROW(ctxt);
              }
            }
            iVar3 = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
              (*xmlFree)(pxVar6);
              return;
            }
          }
          if (local_54 == 1) {
            pxVar6[uVar10] = (xmlChar)val;
            uVar10 = uVar10 + 1;
          }
          else {
            iVar4 = xmlCopyCharMultiByte(pxVar6 + uVar10,val);
            uVar10 = uVar10 + (long)iVar4;
          }
          pxVar8 = ctxt->input;
          if (*pxVar8->cur == '\n') {
            pxVar8->line = pxVar8->line + 1;
            pxVar8->col = 1;
          }
          else {
            pxVar8->col = pxVar8->col + 1;
          }
          pxVar8->cur = pxVar8->cur + local_54;
          val = xmlCurrentChar(ctxt,&local_54);
          if (val == 0) {
            if (ctxt->progressive == 0) {
              pxVar8 = ctxt->input;
              if (((((long)pxVar8->cur - (long)pxVar8->base < 0x1f5) ||
                   (499 < (long)pxVar8->end - (long)pxVar8->cur)) ||
                  (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
                 ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                xmlGROW(ctxt);
              }
            }
            val = xmlCurrentChar(ctxt,&local_54);
          }
          uVar9 = local_40;
          pxVar7 = pxVar6;
          if (local_38 < uVar10) {
            xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",local_50);
LAB_0015bbb2:
            (*xmlFree)(pxVar7);
            ctxt->instate = xVar1;
            return;
          }
        } while( true );
      }
      xmlErrMemory(ctxt,(char *)0x0);
      goto LAB_0015bb67;
    }
    if (iVar3 != pxVar8->id) {
      xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                     "PI declaration doesn\'t start and stop in the same entity\n");
      pxVar8 = ctxt->input;
      pxVar7 = pxVar8->cur;
    }
    pxVar8->cur = pxVar7 + 2;
    pxVar8->col = pxVar8->col + 2;
    if (pxVar7[2] == '\0') {
      xmlParserInputGrow(pxVar8,0xfa);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var2 = ctxt->sax->processingInstruction, p_Var2 != (processingInstructionSAXFunc)0x0)) {
      (*p_Var2)(ctxt->userData,pxVar6,(xmlChar *)0x0);
    }
  }
LAB_0015bb52:
  if (ctxt->instate == XML_PARSER_EOF) {
    return;
  }
LAB_0015bb67:
  ctxt->instate = xVar1;
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if ((RAW == '<') && (NXT(1) == '?')) {
	int inputid = ctxt->input->id;
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		if (ctxt->instate != XML_PARSER_EOF)
		    ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size);
	    if (buf == NULL) {
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = CUR_CHAR(l);
	    while (IS_CHAR(cur) && /* checked */
		   ((cur != '?') || (NXT(1) != '>'))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    size_t new_size = size * 2;
		    tmp = (xmlChar *) xmlRealloc(buf, new_size);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
                    size = new_size;
		}
		count++;
		if (count > 50) {
		    SHRINK;
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buf);
                        return;
                    }
		    count = 0;
		}
		COPY_BUF(l,buf,len,cur);
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
                if (len > maxLength) {
                    xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                      "PI %s too big found", target);
                    xmlFree(buf);
                    ctxt->instate = state;
                    return;
                }
	    }
	    buf[len] = 0;
	    if (cur != '?') {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if (((state == XML_PARSER_MISC) ||
	             (state == XML_PARSER_START)) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();
		    if ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			(allow == XML_CATA_ALLOW_ALL))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif


		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF)
	    ctxt->instate = state;
    }
}